

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O0

void __thiscall
pzgeom::TPZArc3D::X<double>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<double> *loc,TPZVec<double> *result)

{
  double *pdVar1;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  long in_RDI;
  double dVar2;
  double dVar3;
  int j_1;
  int i_1;
  int j;
  int i;
  double vectRotated;
  double centerCoord;
  double deflection;
  TPZFNMatrix<4,_double> RotMatrix;
  TPZManVector<double,_3> MappedBASE2D;
  TPZManVector<double,_3> *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  TPZFNMatrix<4,_double> *in_stack_fffffffffffffe20;
  int64_t in_stack_fffffffffffffe28;
  TPZManVector<double,_3> *in_stack_fffffffffffffe30;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  double local_140;
  TPZVec<double> local_58;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(double *)in_stack_fffffffffffffe20
            );
  TPZFNMatrix<4,_double>::TPZFNMatrix
            (in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
             (int64_t)in_stack_fffffffffffffe10);
  dVar2 = *(double *)(in_RDI + 0x250);
  dVar3 = *(double *)(in_RDI + 600);
  pdVar1 = TPZVec<double>::operator[](local_18,0);
  dVar2 = (dVar2 * dVar3 * (*pdVar1 + 1.0)) /
          (*(double *)(in_RDI + 600) + *(double *)(in_RDI + 600));
  dVar3 = cos(dVar2);
  pdVar1 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
  *pdVar1 = dVar3;
  dVar3 = sin(dVar2);
  pdVar1 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
  *pdVar1 = dVar3;
  dVar3 = sin(dVar2);
  pdVar1 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
  *pdVar1 = -dVar3;
  dVar2 = cos(dVar2);
  pdVar1 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
  *pdVar1 = dVar2;
  for (local_144 = 0; local_144 < 2; local_144 = local_144 + 1) {
    local_140 = 0.0;
    for (local_148 = 0; local_148 < 2; local_148 = local_148 + 1) {
      pdVar1 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
      dVar2 = *pdVar1;
      pdVar1 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x218),(long)local_148);
      local_140 = dVar2 * *pdVar1 + local_140;
    }
    local_140 = (double)(1 - local_144) * *(double *)(in_RDI + 0x260) +
                (double)local_144 * *(double *)(in_RDI + 0x268) + local_140;
    pdVar1 = TPZVec<double>::operator[](&local_58,(long)local_144);
    *pdVar1 = local_140;
  }
  pdVar1 = TPZVec<double>::operator[](&local_58,2);
  *pdVar1 = 0.0;
  for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
    local_140 = 0.0;
    for (local_150 = 0; local_150 < 3; local_150 = local_150 + 1) {
      in_stack_fffffffffffffe18 =
           TPZFMatrix<double>::GetVal
                     ((TPZFMatrix<double> *)(in_RDI + 0x100),(long)local_14c,(long)local_150);
      in_stack_fffffffffffffe20 =
           (TPZFNMatrix<4,_double> *)TPZVec<double>::operator[](&local_58,(long)local_150);
      local_140 = in_stack_fffffffffffffe18 *
                  (double)(in_stack_fffffffffffffe20->super_TPZFMatrix<double>).
                          super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                          _vptr_TPZSavable + local_140;
    }
    in_stack_fffffffffffffe10 =
         TPZFMatrix<double>::operator()
                   (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                    (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
    dVar2 = *in_stack_fffffffffffffe10;
    in_stack_fffffffffffffe00 =
         (TPZManVector<double,_3> *)TPZVec<double>::operator[](local_20,(long)local_14c);
    (in_stack_fffffffffffffe00->super_TPZVec<double>)._vptr_TPZVec =
         (_func_int **)(local_140 + dVar2);
  }
  TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x17f8d35);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffe00);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            /** Computing initialVector = (iniR2 - CenterR2) */
            TPZManVector<T,3> MappedBASE2D(3,0.);
            
            TPZFNMatrix<4,T> RotMatrix(2,2);
            T deflection = fAngle * fRadius * (loc[0] + 1.) / (2.*fRadius);
            RotMatrix(0,0) =  cos(deflection); RotMatrix(0,1) = sin(deflection);
            RotMatrix(1,0) = -sin(deflection); RotMatrix(1,1) = cos(deflection);
            
            /** MappedPoint_R2 = centerCoord + vectorRotated , where Vx = RotationMatrix . Va */
            T centerCoord, vectRotated = 0.;
            for(int i = 0; i < 2; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 2; j++) vectRotated += RotMatrix(i,j)*finitialVector[j];
                centerCoord = (1-i)*fXcenter + i*fYcenter;
                MappedBASE2D[i] = centerCoord + vectRotated;
            }
            
            /** Changing Basis of Obtained MappedPoint from R2 to R3 */
            MappedBASE2D[2] = 0.;
            for(int i = 0; i < 3; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 3; j++)
                {
                    vectRotated += fIBaseCn.GetVal(i,j)*MappedBASE2D[j];
                }
                result[i] = vectRotated + coord(i,2);
            }

        }